

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O1

void __thiscall CVmDynamicFunc::save_to_file(CVmDynamicFunc *this,CVmFile *fp)

{
  vm_val_t *val;
  uint16_t tmp;
  long lVar1;
  char b [2];
  char b_1 [2];
  char buf [5];
  undefined2 local_2c;
  undefined2 local_2a;
  vm_prop_id_t local_28;
  char local_25 [5];
  
  val = (vm_val_t *)(this->super_CVmObject).ext_;
  local_2a = (undefined2)val[2].typ;
  CVmFile::write_bytes(fp,(char *)&local_2a,2);
  local_28 = val[2].val.prop;
  CVmFile::write_bytes(fp,(char *)&local_28,2);
  vmb_put_dh(local_25,val + 1);
  CVmFile::write_bytes(fp,local_25,5);
  vmb_put_dh(local_25,val);
  CVmFile::write_bytes(fp,local_25,5);
  CVmFile::write_bytes(fp,(char *)(&val[3].typ + val[2].val.intval),*(size_t *)(val + 2));
  if (0 < val[2].val.intval) {
    lVar1 = 0;
    do {
      local_2c = *(undefined2 *)((long)&val[2].val + lVar1 * 4 + 4);
      CVmFile::write_bytes(fp,(char *)&local_2c,2);
      lVar1 = lVar1 + 1;
    } while (lVar1 < val[2].val.intval);
  }
  return;
}

Assistant:

void CVmDynamicFunc::save_to_file(VMG_ class CVmFile *fp)
{
    char buf[VMB_DATAHOLDER];
    vm_dynfunc_ext *ext = get_ext();

    /* write our source code length */
    fp->write_uint2(ext->bytecode_len);

    /* write our object reference count */
    fp->write_uint2(ext->obj_ref_cnt);

    /* write the method context object */
    vmb_put_dh(buf, &ext->method_ctx);
    fp->write_bytes(buf, VMB_DATAHOLDER);

    /* write our source object value */
    vmb_put_dh(buf, &ext->src);
    fp->write_bytes(buf, VMB_DATAHOLDER);

    /* write the bytecode data */
    fp->write_bytes(ext->get_bytecode_ptr(), ext->bytecode_len);

    /* write the object reference list */
    for (int i = 0 ; i < ext->obj_ref_cnt ; ++i)
        fp->write_uint2(ext->obj_refs[i]);
}